

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoApproveIfMissingReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::AutoApproveIfMissingReporter::report
          (AutoApproveIfMissingReporter *this,string *received,string *approved)

{
  bool bVar1;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *this_00;
  string local_78 [48];
  string local_48 [32];
  undefined8 local_28;
  bool local_1;
  
  this_00 = in_RDX;
  bVar1 = FileUtils::fileExists(in_RDI);
  if (bVar1) {
    local_1 = false;
  }
  else {
    local_28 = 0;
    AutoApproveReporter::AutoApproveReporter((AutoApproveReporter *)in_RDX);
    ::std::__cxx11::string::string(local_48,(string *)in_RSI);
    ::std::__cxx11::string::string(local_78,(string *)this_00);
    local_1 = AutoApproveReporter::report((AutoApproveReporter *)this_00,in_RSI,in_RDX);
    ::std::__cxx11::string::~string(local_78);
    ::std::__cxx11::string::~string(local_48);
    AutoApproveReporter::~AutoApproveReporter((AutoApproveReporter *)0x165085);
  }
  return local_1;
}

Assistant:

bool AutoApproveIfMissingReporter::report(std::string received,
                                              std::string approved) const
    {
        if (FileUtils::fileExists(approved))
        {
            return false;
        }

        return AutoApproveReporter().report(received, approved);
    }